

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveReader::ReadRealOperand
          (CFFPrimitiveReader *this,double *outValue,long *outRealValueFractalEnd)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  EStatusCode EVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  Byte buffer;
  Byte nibble [2];
  double local_80;
  double local_78;
  
  *outRealValueFractalEnd = 0;
  local_80 = 1.0;
  dVar11 = 0.0;
  bVar8 = false;
  local_78 = 0.0;
  dVar10 = 0.0;
  bVar9 = false;
  bVar3 = false;
  bVar2 = false;
  do {
    EVar4 = ReadByte(this,&buffer);
    if (EVar4 != eSuccess) {
      return eFailure;
    }
    nibble[0] = buffer >> 4;
    nibble[1] = buffer & 0xf;
    lVar5 = *outRealValueFractalEnd;
    bVar6 = true;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      bVar1 = nibble[lVar7];
      switch(bVar1) {
      case 10:
switchD_0017611b_caseD_a:
        bVar9 = true;
        break;
      case 0xb:
        bVar3 = true;
        break;
      case 0xc:
        bVar2 = true;
        break;
      case 0xd:
        break;
      case 0xe:
        bVar8 = true;
        break;
      case 0xf:
        bVar6 = false;
        break;
      default:
        if ((bVar3) || (bVar2)) {
          dVar10 = dVar10 * 10.0 + (double)bVar1;
        }
        else {
          if (bVar9) {
            local_78 = local_78 * 10.0 + (double)bVar1;
            local_80 = local_80 * 10.0;
            lVar5 = lVar5 + 1;
            *outRealValueFractalEnd = lVar5;
            goto switchD_0017611b_caseD_a;
          }
          dVar11 = dVar11 * 10.0 + (double)bVar1;
          bVar9 = false;
        }
      }
    }
    if (!bVar6) {
      dVar11 = dVar11 + local_78 / local_80;
      if ((bVar2) || (bVar3)) {
        if (bVar2) {
          dVar10 = -dVar10;
        }
        dVar10 = pow(10.0,dVar10);
        dVar11 = dVar11 * dVar10;
      }
      if (bVar8) {
        dVar11 = -dVar11;
      }
      *outValue = dVar11;
      return eSuccess;
    }
  } while( true );
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadRealOperand(double& outValue,long& outRealValueFractalEnd)
{
	double integerPart = 0;
	double fractionPart = 0;
	double powerPart = 0;
	double result;
	bool hasNegative = false;
	bool hasFraction = false;
	bool hasPositivePower = false;
	bool hasNegativePower = false;
	bool notDone = true;
	double fractionDecimal = 1;
	outRealValueFractalEnd = 0;
	Byte buffer;
	Byte nibble[2];
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = ReadByte(buffer);
		if(status != PDFHummus::eSuccess)
			break;

		nibble[0] = (buffer >> 4) & 0xf;
		nibble[1] = buffer & 0xf;

		for(int i = 0; i <2; ++i)
		{
			switch(nibble[i])
			{
				case 0xa:
					hasFraction = true;
					break;
				case 0xb:
					hasPositivePower = true;
					break;
				case 0xc:
					hasNegativePower = true;
					break;
				case 0xd:
					// reserved
					break;
				case 0xe:
					hasNegative = true;
					break;
				case 0xf:
					notDone = false;
					break;
				default: // numbers
					if(hasPositivePower || hasNegativePower)
					{
						powerPart = powerPart*10 + nibble[i];
					}
					else if(hasFraction)
					{
						fractionPart = fractionPart * 10 + nibble[i];
						fractionDecimal *= 10;
						++outRealValueFractalEnd;
					}
					else
						integerPart = integerPart * 10 + nibble[i];

			}
		}
	}while(notDone);

	if(PDFHummus::eSuccess == status)
	{
		result = integerPart + fractionPart/fractionDecimal;
		if(hasNegativePower || hasPositivePower)
			result = result * pow(10,hasNegativePower ? -powerPart : powerPart);
		if(hasNegative)
			result = -1*result;
		outValue = result;
	}
	return status;
}